

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O2

char * bson_iter_regex(bson_iter_t *iter,char **options)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  
  if (iter != (bson_iter_t *)0x0) {
    puVar2 = iter->raw;
    if (puVar2[iter->type] == '\v') {
      puVar1 = puVar2 + iter->d1;
      puVar2 = puVar2 + iter->d2;
    }
    else {
      puVar1 = (uint8_t *)0x0;
      puVar2 = (uint8_t *)0x0;
    }
    if (options != (char **)0x0) {
      *options = (char *)puVar2;
    }
    return (char *)puVar1;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,0x4ce,"bson_iter_regex","iter");
  abort();
}

Assistant:

const char *
bson_iter_regex (const bson_iter_t *iter, /* IN */
                 const char **options)    /* IN */
{
   const char *ret = NULL;
   const char *ret_options = NULL;

   BSON_ASSERT (iter);

   if (ITER_TYPE (iter) == BSON_TYPE_REGEX) {
      ret = (const char *) (iter->raw + iter->d1);
      ret_options = (const char *) (iter->raw + iter->d2);
   }

   if (options) {
      *options = ret_options;
   }

   return ret;
}